

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QAccessibleInterface * __thiscall
QAccessibleAbstractScrollArea::child(QAccessibleAbstractScrollArea *this,int index)

{
  QAccessibleInterface *pQVar1;
  long in_FS_OFFSET;
  QWidgetList local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  accessibleChildren(&local_30,this);
  pQVar1 = (QAccessibleInterface *)
           QAccessible::queryAccessibleInterface(&local_30.d.ptr[index]->super_QObject);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractScrollArea::child(int index) const
{
    return QAccessible::queryAccessibleInterface(accessibleChildren().at(index));
}